

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_symphony.c
# Opt level: O0

int32_t ll_receive_mode_get(uint8_t *rx_mode)

{
  _Bool _Var1;
  int32_t local_20;
  int32_t ret;
  uint8_t *rx_mode_local;
  
  if (rx_mode == (uint8_t *)0x0) {
    rx_mode_local._4_4_ = -0x65;
  }
  else {
    _Var1 = transport_mutex_grab();
    if (_Var1) {
      local_20 = hal_read_write(OP_RX_MODE_GET,(uint8_t *)0x0,0,_ll_ifc_message_buff,1);
      *rx_mode = _ll_ifc_message_buff[0];
      transport_mutex_release();
      if (-1 < local_20) {
        local_20 = 0;
      }
      rx_mode_local._4_4_ = local_20;
    }
    else {
      rx_mode_local._4_4_ = -0x71;
    }
  }
  return rx_mode_local._4_4_;
}

Assistant:

static int32_t ll_receive_mode_get(uint8_t *rx_mode)
{
    if (rx_mode == NULL)
    {
        return LL_IFC_ERROR_INCORRECT_PARAMETER;
    }

    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }

    int32_t ret = hal_read_write(OP_RX_MODE_GET, NULL, 0, &_ll_ifc_message_buff[0], sizeof(*rx_mode));

    *rx_mode = _ll_ifc_message_buff[0];

    transport_mutex_release();
    return (ret >= 0) ? LL_IFC_ACK : ret;
}